

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * openFile(string *filename)

{
  byte bVar1;
  undefined8 in_RSI;
  allocator local_51;
  string local_50 [8];
  string x;
  string *filename_local;
  ifstream *inFile;
  
  std::ifstream::ifstream(filename);
  std::ifstream::open(filename,in_RSI,8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = std::ios::operator!((ios *)(filename + *(long *)(*(long *)filename + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"Unable to open file");
    exit(1);
  }
  std::__cxx11::string::~string(local_50);
  return filename;
}

Assistant:

ifstream openFile(string filename){
    ifstream inFile;
    inFile.open(filename);
    string x = "";

    if (!inFile) {
        cout << "Unable to open file";
        exit(1); // terminate with error
    }
    return inFile;
}